

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateQName
              (xmlSchemaValidCtxtPtr vctxt,xmlChar *value,xmlSchemaValPtr *val,int valNeeded)

{
  xmlSchemaTypePtr item;
  xmlChar *pxVar1;
  xmlSchemaValPtr pxVar2;
  xmlSchemaValPtr *local_58;
  xmlChar *local_50;
  xmlChar *prefix;
  xmlChar *local;
  xmlChar *nsName;
  xmlChar *stripped;
  int ret;
  int valNeeded_local;
  xmlSchemaValPtr *val_local;
  xmlChar *value_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  local_50 = (xmlChar *)0x0;
  stripped._4_4_ = valNeeded;
  _ret = val;
  val_local = (xmlSchemaValPtr *)value;
  value_local = (xmlChar *)vctxt;
  stripped._0_4_ = xmlValidateQName(value,1);
  if ((int)stripped == 0) {
    nsName = xmlSchemaCollapseString((xmlChar *)val_local);
    local_58 = (xmlSchemaValPtr *)nsName;
    if ((xmlSchemaValPtr *)nsName == (xmlSchemaValPtr *)0x0) {
      local_58 = val_local;
    }
    prefix = xmlSplitQName2((xmlChar *)local_58,&local_50);
    (*xmlFree)(nsName);
    if (prefix == (xmlChar *)0x0) {
      prefix = xmlStrdup((xmlChar *)val_local);
    }
    local = xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)value_local,local_50);
    if ((local_50 == (xmlChar *)0x0) ||
       ((*xmlFree)(local_50), pxVar1 = value_local, local != (xmlChar *)0x0)) {
      if ((stripped._4_4_ == 0) || (_ret == (xmlSchemaValPtr *)0x0)) {
        (*xmlFree)(prefix);
      }
      else if (local == (xmlChar *)0x0) {
        pxVar2 = xmlSchemaNewQNameValue((xmlChar *)0x0,prefix);
        *_ret = pxVar2;
      }
      else {
        pxVar1 = xmlStrdup(local);
        pxVar2 = xmlSchemaNewQNameValue(pxVar1,prefix);
        *_ret = pxVar2;
      }
      vctxt_local._4_4_ = 0;
    }
    else {
      stripped._0_4_ = 0x720;
      item = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pxVar1,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,
                         (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)item,
                         "The QName value \'%s\' has no corresponding namespace declaration in scope"
                         ,(xmlChar *)val_local,(xmlChar *)0x0);
      if (prefix != (xmlChar *)0x0) {
        (*xmlFree)(prefix);
      }
      vctxt_local._4_4_ = (int)stripped;
    }
  }
  else if ((int)stripped == -1) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)value_local,"xmlSchemaValidateQName",
               "calling xmlValidateQName()");
    vctxt_local._4_4_ = -1;
  }
  else {
    vctxt_local._4_4_ = 0x720;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaValidateQName(xmlSchemaValidCtxtPtr vctxt,
		       const xmlChar *value,
		       xmlSchemaValPtr *val,
		       int valNeeded)
{
    int ret;
    xmlChar *stripped;
    const xmlChar *nsName;
    xmlChar *local, *prefix = NULL;

    ret = xmlValidateQName(value, 1);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaValidateQName",
		"calling xmlValidateQName()");
	    return (-1);
	}
	return( XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1);
    }
    /*
    * NOTE: xmlSplitQName2 will always return a duplicated
    * strings.
    */
    /* TODO: Export and use xmlSchemaStrip instead */
    stripped = xmlSchemaCollapseString(value);
    local = xmlSplitQName2(stripped ? stripped : value, &prefix);
    xmlFree(stripped);
    if (local == NULL)
	local = xmlStrdup(value);
    /*
    * OPTIMIZE TODO: Use flags for:
    *  - is there any namespace binding?
    *  - is there a default namespace?
    */
    nsName = xmlSchemaLookupNamespace(vctxt, prefix);

    if (prefix != NULL) {
	xmlFree(prefix);
	/*
	* A namespace must be found if the prefix is
	* NOT NULL.
	*/
	if (nsName == NULL) {
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    xmlSchemaCustomErr(ACTXT_CAST vctxt, ret, NULL,
		WXS_BASIC_CAST xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME),
		"The QName value '%s' has no "
		"corresponding namespace declaration in "
		"scope", value, NULL);
	    if (local != NULL)
		xmlFree(local);
	    return (ret);
	}
    }
    if (valNeeded && val) {
	if (nsName != NULL)
	    *val = xmlSchemaNewQNameValue(
		BAD_CAST xmlStrdup(nsName), BAD_CAST local);
	else
	    *val = xmlSchemaNewQNameValue(NULL,
		BAD_CAST local);
    } else
	xmlFree(local);
    return (0);
}